

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O2

bool tinyusdz::LayerToStage(Layer *layer,Stage *stage_out,string *warn,string *err)

{
  value_type *prim;
  __node_base *p_Var1;
  optional<tinyusdz::Prim> pv;
  optional<tinyusdz::Prim> local_19f0;
  Stage stage;
  
  if (stage_out == (Stage *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
  }
  else {
    Stage::Stage(&stage);
    LayerMetas::operator=(&stage.stage_metas,&layer->_metas);
    p_Var1 = &(layer->_prim_specs)._M_h._M_before_begin;
    while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
      detail::ReconstructPrimFromPrimSpec(&local_19f0,(PrimSpec *)(p_Var1 + 5),warn,err);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>(&pv,&local_19f0);
      nonstd::optional_lite::optional<tinyusdz::Prim>::~optional(&local_19f0);
      if (pv.has_value_ == true) {
        prim = nonstd::optional_lite::optional<tinyusdz::Prim>::value(&pv);
        Stage::add_root_prim(&stage,prim,true);
      }
      nonstd::optional_lite::optional<tinyusdz::Prim>::~optional(&pv);
    }
    Stage::operator=(stage_out,&stage);
    Stage::~Stage(&stage);
  }
  return stage_out != (Stage *)0x0;
}

Assistant:

bool LayerToStage(const Layer &layer, Stage *stage_out, std::string *warn,
                  std::string *err) {
  if (!stage_out) {
    if (err) {
      (*err) += "`stage_ptr` is nullptr.";
    }
    return false;
  }

  Stage stage;

  stage.metas() = layer.metas();

  // TODO: primChildren metadatum
  for (const auto &primspec : layer.primspecs()) {
    if (auto pv =
            detail::ReconstructPrimFromPrimSpec(primspec.second, warn, err)) {
      stage.add_root_prim(std::move(pv.value()));
    }
  }

  (*stage_out) = stage;

  return true;
}